

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall
ON_SubD::VertexHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubD *this,ON_SubDHashType hash_type)

{
  element_type *peVar1;
  ON_SubDLevel *pOVar2;
  ON_SubDimple *subdimple;
  ON_SubDLevel *pOVar3;
  ON_SubDVertexIdIterator vidit;
  ON_SubDVertexIdIterator local_40;
  
  ON_SubDVertexIdIterator::ON_SubDVertexIdIterator(&local_40,this);
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pOVar2 = &ON_SubDLevel::Empty;
  pOVar3 = &ON_SubDLevel::Empty;
  if ((peVar1 != (element_type *)0x0) &&
     (pOVar3 = peVar1->m_active_level, pOVar3 == (ON_SubDLevel *)0x0)) {
    pOVar3 = &ON_SubDLevel::Empty;
  }
  if ((peVar1 != (element_type *)0x0) &&
     (pOVar2 = peVar1->m_active_level, pOVar2 == (ON_SubDLevel *)0x0)) {
    pOVar2 = &ON_SubDLevel::Empty;
  }
  Internal_VertexHash(__return_storage_ptr__,hash_type,pOVar3->m_vertex[0],pOVar2->m_level_index,
                      &local_40);
  ON_SubDRef::~ON_SubDRef(&local_40.m_subd_ref);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubD::VertexHash(ON_SubDHashType hash_type) const
{
  ON_SubDVertexIdIterator vidit(*this);
  return Internal_VertexHash(hash_type, FirstVertex(), this->ActiveLevelIndex(), vidit);
}